

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_wstring.cpp
# Opt level: O0

bool IsCommaDelimitedDoubleArray(wchar_t *wsz,int length,int numDoubles)

{
  ulong uVar1;
  bool bVar2;
  long len;
  wchar_t *q;
  wchar_t *pwStack_690;
  int i;
  wchar_t *p;
  wchar_t buf [401];
  size_t maxChars;
  ON_wString local_28;
  ON_wString s;
  int numDoubles_local;
  int length_local;
  wchar_t *wsz_local;
  
  if (length == 0) {
    wsz_local._7_1_ = false;
  }
  else if ((numDoubles < 1) || (0x10 < numDoubles)) {
    wsz_local._7_1_ = false;
  }
  else {
    s.m_s._0_4_ = numDoubles;
    s.m_s._4_4_ = length;
    if (numDoubles == 1) {
      wsz_local._7_1_ = IsValidRealNumber(wsz,length);
    }
    else {
      ON_wString::ON_wString(&local_28,wsz);
      ON_wString::operator+=(&local_28,L",");
      stack0xffffffffffffffc0 = 400;
      memset(&p,0,0x644);
      pwStack_690 = ON_wString::Array(&local_28);
      for (q._4_4_ = 0; q._4_4_ < (int)s.m_s; q._4_4_ = q._4_4_ + 1) {
        if (*pwStack_690 == L'\0') {
          wsz_local._7_1_ = false;
          goto LAB_0099cec7;
        }
        len = (long)&p;
        while( true ) {
          bVar2 = false;
          if (*pwStack_690 != L',') {
            bVar2 = (ulong)(len - (long)&p >> 2) < 400;
          }
          if (!bVar2) break;
          *(wchar_t *)len = *pwStack_690;
          len = len + 4;
          pwStack_690 = pwStack_690 + 1;
        }
        *(undefined4 *)len = 0;
        pwStack_690 = pwStack_690 + 1;
        uVar1 = len - (long)&p >> 2;
        if (399 < uVar1) {
          wsz_local._7_1_ = false;
          goto LAB_0099cec7;
        }
        bVar2 = IsValidRealNumber((wchar_t *)&p,(int)uVar1);
        if (!bVar2) {
          wsz_local._7_1_ = false;
          goto LAB_0099cec7;
        }
      }
      wsz_local._7_1_ = true;
LAB_0099cec7:
      ON_wString::~ON_wString(&local_28);
    }
  }
  return wsz_local._7_1_;
}

Assistant:

static bool IsCommaDelimitedDoubleArray(const wchar_t* wsz, int length, int numDoubles)
{
  if (length == 0)
   return false;

  if ((numDoubles < 1) || (numDoubles > 16))
    return false;

  if (1 == numDoubles) // Optimization.
    return ::IsValidRealNumber(wsz, length);

  // Make sure the input buffer ends with a comma; simplifies the following loop.
  ON_wString s(wsz);
  s += L",";

  // Temporary buffer for isolating each 'double' string element.
  constexpr size_t maxChars = 400;
  wchar_t buf[maxChars+1] = { 0 };

  // Use 'p' to scan the input buffer.
  const auto* p = s.Array();

  for (int i = 0; i < numDoubles; i++)
  {
    // 4th January 2024 John Croudy, https://mcneel.myjetbrains.com/youtrack/issue/RH-79458
    // If we've reached the end of the input buffer, we've run out of string elements early; fail.
    if (0 == *p)
      return false;

    // Copy the next comma-delimited element to buf. (q - buf) is the length copied so far.
    wchar_t* q = buf;
    while ((*p != L',') && ((q - buf) < maxChars))
      *q++ = *p++;
    *q = 0;
    p++;

    const auto len = q - buf;
    if (len >= maxChars)
      return false;

    // Check that the element in the buffer is a valid real number (double).
    if (!::IsValidRealNumber(buf, int(len)))
      return false;
  }

  return true;
}